

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O2

bool Function_Template::form4_Resize(ResizeForm4 Resize)

{
  uint8_t uVar1;
  bool bVar2;
  allocator_type local_f1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> roiHeight;
  vector<unsigned_int,_std::allocator<unsigned_int>_> roiWidth;
  vector<unsigned_int,_std::allocator<unsigned_int>_> roiY;
  vector<unsigned_int,_std::allocator<unsigned_int>_> roiX;
  Image output;
  vector<unsigned_char,_std::allocator<unsigned_char>_> intensity;
  Image input;
  
  Unit_Test::intensityArray(&intensity,2);
  uVar1 = *intensity.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate(&output,0,0,'\x01','\x01');
  Test_Helper::uniformImage(&input,uVar1,0,0,&output);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&output);
  uVar1 = intensity.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start[1];
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            ((ImageTemplate<unsigned_char> *)&roiX,0,0,'\x01','\x01');
  Test_Helper::uniformImage(&output,uVar1,0,0,(Image *)&roiX);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)&roiX);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&roiX,2,(allocator_type *)&roiY);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&roiY,2,(allocator_type *)&roiWidth);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&roiWidth,2,(allocator_type *)&roiHeight);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&roiHeight,2,&local_f1);
  Unit_Test::generateRoi
            (&input,roiX.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
             roiY.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start,
             roiWidth.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start,
             roiHeight.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start);
  Unit_Test::generateRoi
            (&output,roiX.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start + 1,
             roiY.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start + 1,
             roiWidth.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start + 1,
             roiHeight.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start + 1);
  (*Resize)(&input,*roiX.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
            *roiY.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start,
            *roiWidth.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start,
            *roiHeight.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start,&output,
            roiX.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start[1],
            roiY.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start[1],
            roiWidth.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start[1],
            roiHeight.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start[1]);
  bVar2 = Unit_Test::verifyImage
                    (&output,roiX.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                             _M_impl.super__Vector_impl_data._M_start[1],
                     roiY.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start[1],
                     roiWidth.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start[1],
                     roiHeight.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start[1],
                     *intensity.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&roiHeight.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&roiWidth.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&roiY.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&roiX.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&output);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&input);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&intensity.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return bVar2;
}

Assistant:

bool form4_Resize(ResizeForm4 Resize)
    {
        const std::vector < uint8_t > intensity = intensityArray( 2 );
        const PenguinV_Image::Image input  = uniformImage( intensity[0] );
        PenguinV_Image::Image output = uniformImage( intensity[1] );

        std::vector < uint32_t > roiX( 2 ), roiY( 2 ), roiWidth( 2 ), roiHeight( 2 );

        generateRoi( input, roiX[0], roiY[0], roiWidth[0], roiHeight[0] );
        generateRoi( output, roiX[1], roiY[1], roiWidth[1], roiHeight[1] );

        Resize( input, roiX[0], roiY[0], roiWidth[0], roiHeight[0], output, roiX[1], roiY[1], roiWidth[1], roiHeight[1] );

        return verifyImage( output, roiX[1], roiY[1], roiWidth[1], roiHeight[1], intensity[0] );
    }